

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O3

void pollAbsState(_GLFWjoystick *js)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int code;
  long lVar4;
  
  lVar2 = 0x197c;
  lVar3 = 0x187c;
  lVar4 = 0;
  do {
    if (-1 < *(int *)(js->guid + lVar3 + -0x48)) {
      iVar1 = ioctl((js->linjs).fd,lVar4 + 0x80184540,js->guid + lVar2 + -0x48);
      if (-1 < iVar1) {
        handleAbsEvent(js,(int)lVar4,*(int *)(js->guid + lVar2 + -0x48));
      }
    }
    lVar4 = lVar4 + 1;
    lVar2 = lVar2 + 0x18;
    lVar3 = lVar3 + 4;
  } while (lVar4 != 0x40);
  return;
}

Assistant:

static void pollAbsState(_GLFWjoystick* js)
{
    for (int code = 0;  code < ABS_CNT;  code++)
    {
        if (js->linjs.absMap[code] < 0)
            continue;

        struct input_absinfo* info = &js->linjs.absInfo[code];

        if (ioctl(js->linjs.fd, EVIOCGABS(code), info) < 0)
            continue;

        handleAbsEvent(js, code, info->value);
    }
}